

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
** __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
::mutable_child(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                *this,size_type i)

{
  template_ElementType<3UL> *ppbVar1;
  size_type i_local;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *this_local;
  
  ppbVar1 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
            ::GetField<3ul>((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
                             *)this);
  return ppbVar1 + i;
}

Assistant:

btree_node *&mutable_child(size_type i) { return GetField<3>()[i]; }